

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::VarintErrorCasesWithSizes_ReadVarint64Error_Test::TestBody
          (VarintErrorCasesWithSizes_ReadVarint64Error_Test *this)

{
  int block_size;
  size_t sVar1;
  ParamType *pPVar2;
  char *message;
  Message local_e0;
  AssertHelper local_d8;
  AssertionResult gtest_ar;
  uint64_t value;
  VarintErrorCase kVarintErrorCases_case;
  CodedInputStream coded_input;
  ArrayInputStream input;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  kVarintErrorCases_case.bytes._0_8_ =
       *(undefined8 *)
        (pPVar2->
        super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
        super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
        _M_head_impl.bytes;
  kVarintErrorCases_case._8_8_ =
       *(undefined8 *)
        ((pPVar2->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
         _M_head_impl.bytes + 8);
  kVarintErrorCases_case.size =
       (pPVar2->
       super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
       super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
       _M_head_impl.size;
  kVarintErrorCases_case.can_parse =
       (pPVar2->
       super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
       super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
       _M_head_impl.can_parse;
  kVarintErrorCases_case._25_7_ =
       *(undefined7 *)
        &(pPVar2->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
         _M_head_impl.field_0x19;
  kVarintErrorCases_case.name =
       (pPVar2->
       super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>).
       super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>.
       _M_head_impl.name;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  sVar1 = kVarintErrorCases_case.size;
  block_size = (pPVar2->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
               ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  memcpy(&io::(anonymous_namespace)::CodedStreamTest::buffer_,&kVarintErrorCases_case,
         kVarintErrorCases_case.size);
  ArrayInputStream::ArrayInputStream
            (&input,&io::(anonymous_namespace)::CodedStreamTest::buffer_,(int)sVar1,block_size);
  CodedInputStream::CodedInputStream(&coded_input,&input.super_ZeroCopyInputStream);
  local_e0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = CodedInputStream::ReadVarint64(&coded_input,&value);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"kVarintErrorCases_case.can_parse",
             "coded_input.ReadVarint64(&value)",&kVarintErrorCases_case.can_parse,(bool *)&local_e0)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_e0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x1ad,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((long *)CONCAT71(local_e0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_e0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_e0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  CodedInputStream::~CodedInputStream(&coded_input);
  return;
}

Assistant:

TEST_P(VarintErrorCasesWithSizes, ReadVarint64Error) {
  VarintErrorCase kVarintErrorCases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintErrorCases_case.bytes, kVarintErrorCases_case.size);
  ArrayInputStream input(buffer_, static_cast<int>(kVarintErrorCases_case.size),
                         kBlockSizes_case);
  CodedInputStream coded_input(&input);

  uint64_t value;
  EXPECT_EQ(kVarintErrorCases_case.can_parse, coded_input.ReadVarint64(&value));
}